

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SRUP_Join_Cmd.cpp
# Opt level: O1

bool __thiscall SRUP_MSG_JOIN_CMD::Serialize(SRUP_MSG_JOIN_CMD *this,bool preSign)

{
  uint16_t l;
  uint8_t uVar1;
  bool bVar2;
  uint8_t *puVar3;
  uint8_t *puVar4;
  uint8_t *puVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  
  puVar3 = (uint8_t *)operator_new__(1);
  puVar4 = (uint8_t *)operator_new__(1);
  if (((this->super_SRUP_MSG_SIMPLE).super_SRUP_MSG.m_sequence_ID == (uint64_t *)0x0) ||
     ((this->super_SRUP_MSG_SIMPLE).super_SRUP_MSG.m_sender_ID == (uint64_t *)0x0)) {
    operator_delete__(puVar3);
    operator_delete__(puVar4);
LAB_0010f37e:
    bVar2 = false;
  }
  else {
    uVar6 = 0;
    if (!preSign) {
      uVar6 = (uint)(this->super_SRUP_MSG_SIMPLE).super_SRUP_MSG.m_sig_len;
    }
    (this->super_SRUP_MSG_SIMPLE).super_SRUP_MSG.m_serial_length =
         (uint)(this->super_SRUP_MSG_SIMPLE).super_SRUP_MSG.m_token_len + (uint)!preSign * 2 + uVar6
         + 0x1c;
    puVar5 = (this->super_SRUP_MSG_SIMPLE).super_SRUP_MSG.m_serialized;
    if (puVar5 != (uint8_t *)0x0) {
      operator_delete__(puVar5);
    }
    uVar8 = (ulong)(this->super_SRUP_MSG_SIMPLE).super_SRUP_MSG.m_serial_length;
    puVar5 = (uint8_t *)operator_new__(uVar8);
    (this->super_SRUP_MSG_SIMPLE).super_SRUP_MSG.m_serialized = puVar5;
    lVar7 = 0;
    memset(puVar5,0,uVar8);
    *puVar5 = *(this->super_SRUP_MSG_SIMPLE).super_SRUP_MSG.m_version;
    puVar5[1] = *(this->super_SRUP_MSG_SIMPLE).super_SRUP_MSG.m_msgtype;
    do {
      uVar1 = SRUP_MSG::getByteVal
                        (*(this->super_SRUP_MSG_SIMPLE).super_SRUP_MSG.m_sequence_ID,(uint8_t)lVar7)
      ;
      (this->super_SRUP_MSG_SIMPLE).super_SRUP_MSG.m_serialized[lVar7 + 2] = uVar1;
      lVar7 = lVar7 + 1;
    } while ((int)lVar7 != 8);
    lVar7 = 0;
    do {
      uVar1 = SRUP_MSG::getByteVal
                        (*(this->super_SRUP_MSG_SIMPLE).super_SRUP_MSG.m_sender_ID,(uint8_t)lVar7);
      (this->super_SRUP_MSG_SIMPLE).super_SRUP_MSG.m_serialized[lVar7 + 10] = uVar1;
      lVar7 = lVar7 + 1;
    } while ((int)lVar7 != 8);
    SRUP_MSG::encodeLength(puVar4,puVar3,(this->super_SRUP_MSG_SIMPLE).super_SRUP_MSG.m_token_len);
    (this->super_SRUP_MSG_SIMPLE).super_SRUP_MSG.m_serialized[0x12] = *puVar3;
    (this->super_SRUP_MSG_SIMPLE).super_SRUP_MSG.m_serialized[0x13] = *puVar4;
    memcpy((this->super_SRUP_MSG_SIMPLE).super_SRUP_MSG.m_serialized + 0x14,
           (this->super_SRUP_MSG_SIMPLE).super_SRUP_MSG.m_token,
           (ulong)(this->super_SRUP_MSG_SIMPLE).super_SRUP_MSG.m_token_len);
    uVar9 = (ulong)(this->super_SRUP_MSG_SIMPLE).super_SRUP_MSG.m_token_len;
    uVar8 = uVar9 + 0x14;
    if (!preSign) {
      if (((this->super_SRUP_MSG_SIMPLE).super_SRUP_MSG.m_signature == (uint8_t *)0x0) ||
         (l = (this->super_SRUP_MSG_SIMPLE).super_SRUP_MSG.m_sig_len, l == 0)) goto LAB_0010f37e;
      SRUP_MSG::encodeLength(puVar4,puVar3,l);
      (this->super_SRUP_MSG_SIMPLE).super_SRUP_MSG.m_serialized[uVar8] = *puVar3;
      (this->super_SRUP_MSG_SIMPLE).super_SRUP_MSG.m_serialized[uVar9 + 0x15] = *puVar4;
      memcpy((this->super_SRUP_MSG_SIMPLE).super_SRUP_MSG.m_serialized + uVar9 + 0x16,
             (this->super_SRUP_MSG_SIMPLE).super_SRUP_MSG.m_signature,
             (ulong)(this->super_SRUP_MSG_SIMPLE).super_SRUP_MSG.m_sig_len);
      uVar8 = (ulong)((uint)(this->super_SRUP_MSG_SIMPLE).super_SRUP_MSG.m_sig_len +
                     (int)(uVar9 + 0x16));
    }
    lVar7 = 0;
    do {
      uVar1 = SRUP_MSG::getByteVal(*this->m_device_id,(uint8_t)lVar7);
      (this->super_SRUP_MSG_SIMPLE).super_SRUP_MSG.m_serialized[lVar7 + uVar8] = uVar1;
      lVar7 = lVar7 + 1;
    } while ((int)lVar7 != 8);
    operator_delete__(puVar3);
    operator_delete__(puVar4);
    if (preSign) {
      puVar3 = (this->super_SRUP_MSG_SIMPLE).super_SRUP_MSG.m_unsigned_message;
      if (puVar3 != (uint8_t *)0x0) {
        operator_delete__(puVar3);
      }
      uVar6 = (this->super_SRUP_MSG_SIMPLE).super_SRUP_MSG.m_serial_length;
      puVar4 = (uint8_t *)operator_new__((ulong)uVar6);
      (this->super_SRUP_MSG_SIMPLE).super_SRUP_MSG.m_unsigned_message = puVar4;
      puVar3 = (this->super_SRUP_MSG_SIMPLE).super_SRUP_MSG.m_serialized;
      memcpy(puVar4,puVar3,(ulong)uVar6);
      (this->super_SRUP_MSG_SIMPLE).super_SRUP_MSG.m_unsigned_length = uVar6;
      (this->super_SRUP_MSG_SIMPLE).super_SRUP_MSG.m_serial_length = 0;
      if (puVar3 != (uint8_t *)0x0) {
        operator_delete__(puVar3);
      }
      (this->super_SRUP_MSG_SIMPLE).super_SRUP_MSG.m_serialized = (uint8_t *)0x0;
    }
    (this->super_SRUP_MSG_SIMPLE).super_SRUP_MSG.m_is_serialized = true;
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool SRUP_MSG_JOIN_CMD::Serialize(bool preSign)
{
    // As we're using dynamic memory - and only storing / sending the length of the data we have
    // we need to know how long all of the fields are so that we can unmarshall the data at
    // the other end...

    const uint16_t header_size = 26; // Two-bytes for the main header - plus 8 for the sequence ID ...
                                     // Plus 8 for the device ID & 8 for the sender ID...
    const uint8_t field_length_size = 2;

    // We need the number of variable length fields - including the m_sig_len...
    // ... this can't be const as we need to change it depending on whether or not we're in pre-sign.
    // (If we are we need to reduce it by one for the unused m_sig_len
    uint8_t var_length_field_count = 2;

    uint32_t serial_len;
    uint32_t p = 0;

    uint8_t *msb;
    uint8_t *lsb;

    msb = new uint8_t[1];
    lsb = new uint8_t[1];

    // Now check that we have a sequence ID...
    if (m_sequence_ID == nullptr)
    {
        delete[] msb;
        delete[] lsb;
        return false;
    }

    // ...and a sender ID
    if (m_sender_ID == nullptr)
    {
        delete[] msb;
        delete[] lsb;
        return false;
    }

    // If we're calling this as a prelude to signing / verifying then we need to exclude the signature data from the
    // serial data we generate...

    if (preSign)
    {
        serial_len = m_token_len;
        var_length_field_count--;
    }
    else
        serial_len = m_sig_len + m_token_len;


    m_serial_length = serial_len + header_size + (field_length_size * var_length_field_count);

    delete[] m_serialized;

    m_serialized = new uint8_t[m_serial_length];
    std::memset(m_serialized, 0, m_serial_length);

    // The first two fields are fixed length (1 byte each).
    std::memcpy(m_serialized, m_version, 1);
    p+=1;
    std::memcpy(m_serialized + p, m_msgtype, 1);
    p+=1;

    // Now we need to add the Sequence ID (uint64_t)
    // See SRUP_Init.cpp for details...
    for (int x=0;x<8;x++)
    {
        uint8_t byte;
        byte = getByteVal(*m_sequence_ID, x);
        std::memcpy(m_serialized + p, &byte, 1);
        p+=1;
    }

    // ...and the same for the sender ID
    for (int x=0;x<8;x++)
    {
        uint8_t byte;
        byte = getByteVal(*m_sender_ID, x);
        std::memcpy(m_serialized + p, &byte, 1);
        p+=1;
    }

    // All of the other fields need their length to be specified...

    // Token...
    encodeLength(lsb, msb, m_token_len);
    std::memcpy(m_serialized + p, msb, 1);
    p+=1;
    std::memcpy(m_serialized + p, lsb, 1);
    p+=1;
    std::memcpy(m_serialized + p, m_token, m_token_len);
    p+=m_token_len;

    // If we're executing Serialize as a part of generating the signature - we can't marshall the signature
    // as we haven't calculated it yet. So only do the signature if we're not in preSign

    if (!preSign)
    {
        if (m_signature == nullptr)
            return false;
        else
        {
            if (m_sig_len == 0)
                return false;
            else
            {
                encodeLength(lsb, msb, m_sig_len);
                std::memcpy(m_serialized + p, msb, 1);
                p += 1;
                std::memcpy(m_serialized + p, lsb, 1);
                p += 1;
                std::memcpy(m_serialized + p, m_signature, m_sig_len);
                p += m_sig_len;
            }
        }
    }

    // Lastly we do the device ID (fixed size)
    for (int x=0;x<8;x++)
    {
        uint8_t byte;
        byte = getByteVal(*m_device_id, x);
        std::memcpy(m_serialized + p, &byte, 1);
        p+=1;
    }

    delete[] msb;
    delete[] lsb;

    // If we're in preSign we don't have a real value for m_serialized - so copy the data to m_unsigned_message
    // and discard (and reset) m_serialized & m_serial_length...
    if (preSign)
    {
        delete[] m_unsigned_message;
        m_unsigned_message = new unsigned char[m_serial_length];

        std::memcpy(m_unsigned_message, m_serialized, m_serial_length);
        m_unsigned_length = m_serial_length;

        m_serial_length = 0;
        delete[] m_serialized;
        m_serialized= nullptr;
    }

    m_is_serialized = true;
    return true;
}